

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenFaceNormalsProcess.cpp
# Opt level: O1

void __thiscall Assimp::GenFaceNormalsProcess::Execute(GenFaceNormalsProcess *this,aiScene *pScene)

{
  bool bVar1;
  Logger *pLVar2;
  runtime_error *this_00;
  bool bVar3;
  ulong uVar4;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  pLVar2 = DefaultLogger::get();
  Logger::debug(pLVar2,"GenFaceNormalsProcess begin");
  if ((pScene->mFlags & 8) != 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_48,
               "Post-processing order mismatch: expecting pseudo-indexed (\"verbose\") vertices here"
               ,"");
    std::runtime_error::runtime_error(this_00,(string *)local_48);
    *(undefined ***)this_00 = &PTR__runtime_error_007fd498;
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  if (pScene->mNumMeshes != 0) {
    uVar4 = 0;
    bVar3 = false;
    do {
      bVar1 = GenMeshFaceNormals(this,pScene->mMeshes[uVar4]);
      if (bVar1) {
        bVar3 = true;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < pScene->mNumMeshes);
    if (bVar3) {
      pLVar2 = DefaultLogger::get();
      Logger::info(pLVar2,"GenFaceNormalsProcess finished. Face normals have been calculated");
      return;
    }
  }
  pLVar2 = DefaultLogger::get();
  Logger::debug(pLVar2,"GenFaceNormalsProcess finished. Normals are already there");
  return;
}

Assistant:

void GenFaceNormalsProcess::Execute( aiScene* pScene) {
    ASSIMP_LOG_DEBUG("GenFaceNormalsProcess begin");

    if (pScene->mFlags & AI_SCENE_FLAGS_NON_VERBOSE_FORMAT) {
        throw DeadlyImportError("Post-processing order mismatch: expecting pseudo-indexed (\"verbose\") vertices here");
    }

    bool bHas = false;
    for( unsigned int a = 0; a < pScene->mNumMeshes; a++)   {
        if(this->GenMeshFaceNormals( pScene->mMeshes[a])) {
            bHas = true;
        }
    }
    if (bHas)   {
        ASSIMP_LOG_INFO("GenFaceNormalsProcess finished. "
            "Face normals have been calculated");
    } else {
        ASSIMP_LOG_DEBUG("GenFaceNormalsProcess finished. "
            "Normals are already there");
    }
}